

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::api::anon_unknown_1::createMultipleUniqueResourcesTest<vkt::api::(anonymous_namespace)::Buffer>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,Context *context,
          Parameters params)

{
  TestStatus *pTVar1;
  Context *pCVar2;
  VkDevice device;
  VkBufferUsageFlags VVar3;
  Unique<vk::Handle<(vk::HandleType)8>_> obj2;
  Unique<vk::Handle<(vk::HandleType)8>_> obj3;
  Unique<vk::Handle<(vk::HandleType)8>_> obj1;
  Unique<vk::Handle<(vk::HandleType)8>_> obj0;
  Environment env;
  Move<vk::Handle<(vk::HandleType)8>_> local_168;
  TestStatus *local_140;
  Context *local_138;
  DeviceInterface *local_130;
  Move<vk::Handle<(vk::HandleType)8>_> local_128;
  VkBufferCreateInfo local_100;
  Move<vk::Handle<(vk::HandleType)8>_> local_c8;
  VkBuffer local_a8;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_a0;
  undefined8 local_88;
  DeviceInterface *local_80;
  VkDevice local_78;
  deUint32 local_70 [2];
  undefined8 local_68;
  VkAllocationCallbacks *local_60;
  undefined4 local_58;
  Move<vk::Handle<(vk::HandleType)8>_> local_50;
  
  VVar3 = (VkBufferUsageFlags)params.size;
  local_88 = *(undefined8 *)(this + 8);
  local_140 = __return_storage_ptr__;
  local_138 = context;
  local_130 = Context::getDeviceInterface((Context *)this);
  local_80 = local_130;
  device = Context::getDevice((Context *)this);
  local_78 = device;
  local_70[0] = Context::getUniversalQueueFamilyIndex((Context *)this);
  local_68 = *(undefined8 *)(this + 0x10);
  local_60 = (VkAllocationCallbacks *)0x0;
  local_58 = 1;
  local_100.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  local_100.pNext = (void *)0x0;
  local_100.flags = 0;
  local_100.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_100.queueFamilyIndexCount = 1;
  local_100.size = (VkDeviceSize)context;
  local_100.usage = VVar3;
  local_100.pQueueFamilyIndices = local_70;
  ::vk::createBuffer(&local_c8,local_130,device,&local_100,(VkAllocationCallbacks *)0x0);
  pCVar2 = local_138;
  local_a8.m_internal =
       local_c8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  DStack_a0.m_deviceIface =
       local_c8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  DStack_a0.m_device =
       local_c8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  DStack_a0.m_allocator =
       local_c8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  local_100.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  local_100.pNext = (void *)0x0;
  local_100.flags = 0;
  local_100.size = (VkDeviceSize)local_138;
  local_100.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_100.queueFamilyIndexCount = 1;
  local_100.usage = VVar3;
  local_100.pQueueFamilyIndices = local_70;
  ::vk::createBuffer(&local_168,local_80,local_78,&local_100,local_60);
  local_c8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
       local_168.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  local_c8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       local_168.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  local_c8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       local_168.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  local_c8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       local_168.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  local_100.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  local_100.pNext = (void *)0x0;
  local_100.flags = 0;
  local_100.size = (VkDeviceSize)pCVar2;
  local_100.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_100.queueFamilyIndexCount = 1;
  local_100.usage = VVar3;
  local_100.pQueueFamilyIndices = local_70;
  ::vk::createBuffer(&local_128,local_80,local_78,&local_100,local_60);
  local_168.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
       local_128.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       local_128.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       local_128.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       local_128.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  local_100.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  local_100.pNext = (void *)0x0;
  local_100.flags = 0;
  local_100.size = (VkDeviceSize)pCVar2;
  local_100.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_100.queueFamilyIndexCount = 1;
  local_100.usage = VVar3;
  local_100.pQueueFamilyIndices = local_70;
  ::vk::createBuffer(&local_50,local_80,local_78,&local_100,local_60);
  pTVar1 = local_140;
  local_128.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
       local_50.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  local_128.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       local_50.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  local_128.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       local_50.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  local_128.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       local_50.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  if (local_50.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_128.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_50.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
  }
  if (local_168.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_168.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_168.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
  }
  if (local_c8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_c8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_c8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
  }
  if (local_a8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_a0,local_a8);
  }
  local_100._0_8_ = (void *)((long)&local_100 + 0x10U);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"Ok","");
  pTVar1->m_code = QP_TEST_RESULT_PASS;
  (pTVar1->m_description)._M_dataplus._M_p = (pointer)&(pTVar1->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pTVar1->m_description,local_100._0_8_,
             (long)local_100.pNext + local_100._0_8_);
  if ((void *)local_100._0_8_ != (void *)((long)&local_100 + 0x10U)) {
    operator_delete((void *)local_100._0_8_,CONCAT44(local_100._20_4_,local_100.flags) + 1);
  }
  return pTVar1;
}

Assistant:

tcu::TestStatus createMultipleUniqueResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env		(context, 1u);
	const typename Object::Resources	res0	(env, params);
	const typename Object::Resources	res1	(env, params);
	const typename Object::Resources	res2	(env, params);
	const typename Object::Resources	res3	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res0, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res1, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res2, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res3, params));
	}

	return tcu::TestStatus::pass("Ok");
}